

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O1

ostream * __thiscall wasm::anon_unknown_0::TypePrinter::print(TypePrinter *this,Array *array)

{
  ostream *poVar1;
  char local_19;
  
  std::__ostream_insert<char,std::char_traits<char>>(this->os,"(array ",7);
  print(this,&array->element);
  local_19 = ')';
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(this->os,&local_19,1);
  return poVar1;
}

Assistant:

std::ostream& TypePrinter::print(const Array& array) {
  os << "(array ";
  print(array.element);
  return os << ')';
}